

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O1

Var Js::WabtInterface::EntryConvertWast2Wasm(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  charcount_t cchSource;
  undefined4 *puVar5;
  Var pvVar6;
  DynamicObject *instance;
  char16 *source;
  utf8char_t *dest;
  RecyclableObject *pRVar7;
  char16 *requestedBytes;
  int in_stack_00000010;
  code *local_140;
  SpecContext spec;
  ArenaAllocator arena;
  Context context;
  JavascriptString *string;
  ChakraContext wabtCtx;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x6d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00da3ec3;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  wabtCtx._24_8_ = args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&wabtCtx.features,(CallInfo *)&args.super_Arguments.Values);
  if ((wabtCtx._24_8_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x6e,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) goto LAB_00da3ec3;
    *puVar5 = 0;
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x70,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00da3ec3;
    *puVar5 = 0;
  }
  if ((wabtCtx._24_8_ & 0xfffffe) == 0) {
LAB_00da3eb4:
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e4a6,(PCWSTR)0x0);
  }
  pvVar6 = Arguments::operator[]((Arguments *)&wabtCtx.features,1);
  bVar2 = VarIs<Js::JavascriptString>(pvVar6);
  if (!bVar2) goto LAB_00da3eb4;
  if ((wabtCtx._24_4_ & 0xffffff) < 3) {
    bVar2 = false;
  }
  else {
    pvVar6 = Arguments::operator[]((Arguments *)&wabtCtx.features,2);
    BVar4 = JavascriptOperators::IsObject(pvVar6);
    if (BVar4 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,L"config");
    }
    pvVar6 = Arguments::operator[]((Arguments *)&wabtCtx.features,2);
    instance = VarTo<Js::DynamicObject>(pvVar6);
    pvVar6 = JavascriptOperators::OP_GetProperty(instance,0xf4,scriptContext);
    BVar4 = JavascriptConversion::ToBoolean(pvVar6,scriptContext);
    bVar2 = BVar4 != 0;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)&spec.push,
             L"Wast2Wasm",&(scriptContext->threadContext->pageAllocator).super_PageAllocator,
             Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  EnterPinnedScope(&context.scriptContext);
  context.scriptContext = (ScriptContext *)Arguments::operator[]((Arguments *)&wabtCtx.features,1);
  source = JavascriptString::GetString((JavascriptString *)context.scriptContext);
  arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       &spec.push;
  context.allocator = (ArenaAllocator *)scriptContext;
  cchSource = JavascriptString::GetLength((JavascriptString *)context.scriptContext);
  if ((cchSource == 0xffffffff) ||
     (requestedBytes = (char16 *)((long)(ulong)cchSource * 3 + 1),
     requestedBytes < (char16 *)(ulong)cchSource)) {
    dest = (utf8char_t *)0x0;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00da3ec3;
      *puVar5 = 0;
    }
    dest = (utf8char_t *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                     ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                      &spec.push,(size_t)requestedBytes);
    if (dest == (utf8char_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00da3ec3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      dest = (utf8char_t *)0x0;
    }
    else {
      source = (char16 *)
               utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                         (dest,(size_t)requestedBytes,source,cchSource);
      if (source <= requestedBytes) goto LAB_00da3dad;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                  ,0x33,"(cbEncoded <= cbDestString)","cbEncoded <= cbDestString");
      if (!bVar3) goto LAB_00da3ec3;
    }
    *puVar5 = 0;
  }
LAB_00da3dad:
  LeavePinnedScope();
  wabtCtx.spec = (SpecContext *)
                 &arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  freeList;
  string = (JavascriptString *)CreateBuffer;
  wabtCtx.user_data._0_1_ = (byte)wabtCtx.user_data & 0xfe | DAT_015aa2ee;
  bVar3 = Wasm::Threads::IsEnabled();
  wabtCtx.user_data._0_1_ = (byte)wabtCtx.user_data & 0xfd | bVar3 * '\x02';
  bVar3 = Wasm::Simd::IsEnabled();
  wabtCtx.user_data._0_1_ = (byte)wabtCtx.user_data & 0xfb | bVar3 << 2;
  bVar3 = Wasm::WasmNontrapping::IsEnabled();
  wabtCtx.user_data._0_1_ = (byte)wabtCtx.user_data & 0xf7 | bVar3 << 3;
  if (bVar2 != false) {
    wabtCtx.createBuffer = (CreateBufferFn)&local_140;
    local_140 = Js::SetProperty;
    spec.setProperty = Int32ToVar;
    spec.int32ToVar = Int64ToVar;
    spec.int64ToVar = StringToVar;
    spec.stringToVar = CreateObject;
    spec.createObject = CreateArray;
    spec.createArray = Push;
  }
  pRVar7 = (RecyclableObject *)
           ChakraWabt::ConvertWast2Wasm((ChakraContext *)&string,(char *)dest,(uint)source,bVar2);
  if (pRVar7 == (RecyclableObject *)0x0) {
    pRVar7 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)&spec.push);
  return pRVar7;
}

Assistant:

Js::Var WabtInterface::EntryConvertWast2Wasm(RecyclableObject* function, CallInfo callInfo, ...)
{
    ScriptContext* scriptContext = function->GetScriptContext();
    PROBE_STACK(function->GetScriptContext(), Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !VarIs<JavascriptString>(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }
    bool isSpecText = false;
    if (args.Info.Count > 2)
    {
        // optional config object
        if (!JavascriptOperators::IsObject(args[2]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject, _u("config"));
        }
        DynamicObject * configObject = VarTo<DynamicObject>(args[2]);

        Js::Var isSpecVar = JavascriptOperators::OP_GetProperty(configObject, PropertyIds::spec, scriptContext);
        isSpecText = JavascriptConversion::ToBool(isSpecVar, scriptContext);
    }

    ArenaAllocator arena(_u("Wast2Wasm"), scriptContext->GetThreadContext()->GetPageAllocator(), Throw::OutOfMemory);
    Context context;
    size_t wastSize;
    char* wastBuffer = nullptr;

    ENTER_PINNED_SCOPE(JavascriptString, string);
    string = (JavascriptString*)args[1];
    const char16* str = string->GetString();
    context.allocator = &arena;
    context.scriptContext = scriptContext;

    size_t origSize = string->GetLength();
    auto allocator = [&arena](size_t size) {return (utf8char_t*)AnewArray(&arena, byte, size);};
    utf8::WideStringToNarrow(allocator, str, origSize, &wastBuffer, &wastSize);
    LEAVE_PINNED_SCOPE();   //  string

    try
    {
        ChakraWabt::SpecContext spec;
        ChakraWabt::ChakraContext wabtCtx;
        wabtCtx.user_data = &context;
        wabtCtx.createBuffer = CreateBuffer;
        wabtCtx.features.sign_extends = CONFIG_FLAG(WasmSignExtends);
        wabtCtx.features.threads = Wasm::Threads::IsEnabled();
        wabtCtx.features.simd = Wasm::Simd::IsEnabled();
        wabtCtx.features.sat_float_to_int = Wasm::WasmNontrapping::IsEnabled();
        if (isSpecText)
        {
            wabtCtx.spec = &spec;
            spec.setProperty = SetProperty;
            spec.int32ToVar = Int32ToVar;
            spec.int64ToVar = Int64ToVar;
            spec.stringToVar = StringToVar;
            spec.createObject = CreateObject;
            spec.createArray = CreateArray;
            spec.push = Push;
        }
        void* result = ChakraWabt::ConvertWast2Wasm(wabtCtx, wastBuffer, (uint)wastSize, isSpecText);
        if (result == nullptr)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        return result;
    }
    catch (ChakraWabt::WabtAPIError& e)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, WABTERR_WabtError, NarrowStringToWide(&context, e.message));
    }
}